

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::IfcZone(IfcZone *this)

{
  *(undefined ***)&(this->super_IfcGroup).field_0xf0 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(char **)&this->field_0x100 = "IfcZone";
  IfcGroup::IfcGroup(&this->super_IfcGroup,&PTR_construction_vtable_24__007c4378);
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject = 0x7c4298;
  *(undefined8 *)&(this->super_IfcGroup).field_0xf0 = 0x7c4360;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x88 = 0x7c42c0;
  (this->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x7c42e8;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xd0 = 0x7c4310;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0xe0 = 0x7c4338;
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}